

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

MoveList * megumax::get_pv(MoveList *__return_storage_ptr__,UCTNode *node,int max_length)

{
  pointer pUVar1;
  iterator __position;
  pointer pMVar2;
  uint uVar3;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar4;
  Move *pMVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  Move local_34;
  
  libchess::MoveList::MoveList(__return_storage_ptr__);
  iVar9 = 0;
  while( true ) {
    pvVar4 = UCTNode::children(node);
    if (((pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
         super__Vector_impl_data._M_start ==
         (pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
         super__Vector_impl_data._M_finish) || (max_length <= iVar9)) {
      return __return_storage_ptr__;
    }
    pvVar4 = UCTNode::children(node);
    uVar3 = select_most_visited_child_index(pvVar4);
    pvVar4 = UCTNode::children(node);
    uVar8 = (ulong)uVar3;
    pUVar1 = (pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar7 < uVar8 || uVar7 - uVar8 == 0) break;
    pMVar5 = UCTNode::move(pUVar1 + uVar8);
    __position._M_current =
         (__return_storage_ptr__->values_).
         super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->values_).
        super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<libchess::Move,std::allocator<libchess::Move>>::
      _M_realloc_insert<libchess::Move_const&>
                ((vector<libchess::Move,std::allocator<libchess::Move>> *)__return_storage_ptr__,
                 __position,&local_34);
    }
    else {
      (__position._M_current)->value_ = pMVar5->value_;
      (__return_storage_ptr__->values_).
      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pvVar4 = UCTNode::children(node);
    pUVar1 = (pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = ((long)(pvVar4->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar7 < uVar8 || uVar7 - uVar8 == 0) break;
    node = pUVar1 + uVar8;
    iVar9 = iVar9 + 1;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
  pMVar2 = (__return_storage_ptr__->values_).
           super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar2 != (pointer)0x0) {
    operator_delete(pMVar2,(long)(__return_storage_ptr__->values_).
                                 super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar2);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

MoveList get_pv(UCTNode* node, const int max_length = 8) {
    MoveList move_list;
    int ply = 0;
    while (!node->children().empty() && ply < max_length) {
        const auto idx = select_most_visited_child_index(node->children());
        move_list.add(node->children().at(idx).move());
        node = &node->children().at(idx);
        ply++;
    }
    return move_list;
}